

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

Optional<unsigned_char> llvm::dwarf::getFixedFormByteSize(Form Form,FormParams Params)

{
  bool bVar1;
  uint uVar2;
  uchar local_1a [4];
  uint8_t local_16;
  uchar local_15 [4];
  uint8_t local_11;
  Form local_10;
  FormParams local_e;
  OptionalStorage<unsigned_char,_true> local_a;
  Form Form_local;
  FormParams Params_local;
  
  uVar2 = (uint)Form;
  local_10 = Form;
  local_e = Params;
  if (uVar2 == 1) {
    bVar1 = FormParams::operator_cast_to_bool(&local_e);
    if (!bVar1) {
      Optional<unsigned_char>::Optional((Optional<unsigned_char> *)&local_a,None);
      return (Optional<unsigned_char>)local_a;
    }
    Optional<unsigned_char>::Optional((Optional<unsigned_char> *)&local_a,&local_e.AddrSize);
    return (Optional<unsigned_char>)local_a;
  }
  if (uVar2 - 3 < 2) goto LAB_0278a55f;
  if (uVar2 == 5) goto LAB_0278a5c8;
  if (uVar2 == 6) goto LAB_0278a5f4;
  if (uVar2 == 7) goto LAB_0278a644;
  if (2 < uVar2 - 8) {
    if (uVar2 - 0xb < 2) goto LAB_0278a5b2;
    if (uVar2 != 0xd) {
      if (uVar2 == 0xe) goto LAB_0278a60a;
      if (uVar2 != 0xf) {
        if (uVar2 == 0x10) {
          bVar1 = FormParams::operator_cast_to_bool(&local_e);
          if (!bVar1) {
            Optional<unsigned_char>::Optional((Optional<unsigned_char> *)&local_a,None);
            return (Optional<unsigned_char>)local_a;
          }
          local_11 = FormParams::getRefAddrByteSize(&local_e);
          Optional<unsigned_char>::Optional((Optional<unsigned_char> *)&local_a,&local_11);
          return (Optional<unsigned_char>)local_a;
        }
        if (uVar2 == 0x11) goto LAB_0278a5b2;
        if (uVar2 == 0x12) goto LAB_0278a5c8;
        if (uVar2 == 0x13) goto LAB_0278a5f4;
        if (uVar2 == 0x14) goto LAB_0278a644;
        if (1 < uVar2 - 0x15) {
          if (uVar2 == 0x17) goto LAB_0278a60a;
          if (uVar2 != 0x18) {
            if (uVar2 == 0x19) {
              local_1a[2] = 0;
              Optional<unsigned_char>::Optional((Optional<unsigned_char> *)&local_a,local_1a + 2);
              return (Optional<unsigned_char>)local_a;
            }
            if (1 < uVar2 - 0x1a) {
              if (uVar2 == 0x1c) goto LAB_0278a5f4;
              if (uVar2 != 0x1d) {
                if (uVar2 == 0x1e) {
                  local_1a[1] = 0x10;
                  Optional<unsigned_char>::Optional
                            ((Optional<unsigned_char> *)&local_a,local_1a + 1);
                  return (Optional<unsigned_char>)local_a;
                }
                if (uVar2 != 0x1f) {
                  if (uVar2 != 0x20) {
                    if (uVar2 == 0x21) {
                      local_1a[0] = '\0';
                      Optional<unsigned_char>::Optional
                                ((Optional<unsigned_char> *)&local_a,local_1a);
                      return (Optional<unsigned_char>)local_a;
                    }
                    if (uVar2 - 0x22 < 2) goto LAB_0278a55f;
                    if (uVar2 != 0x24) {
                      if (uVar2 != 0x25) {
                        if (uVar2 == 0x26) {
LAB_0278a5c8:
                          local_15[2] = 2;
                          Optional<unsigned_char>::Optional
                                    ((Optional<unsigned_char> *)&local_a,local_15 + 2);
                          return (Optional<unsigned_char>)local_a;
                        }
                        if (uVar2 == 0x27) {
                          local_15[1] = 3;
                          Optional<unsigned_char>::Optional
                                    ((Optional<unsigned_char> *)&local_a,local_15 + 1);
                          return (Optional<unsigned_char>)local_a;
                        }
                        if (uVar2 != 0x28) {
                          if (uVar2 == 0x29) goto LAB_0278a5b2;
                          if (uVar2 == 0x2a) goto LAB_0278a5c8;
                          if (uVar2 != 0x2c) {
                            if (1 < uVar2 - 0x1f01) {
                              if (1 < uVar2 - 0x1f20) {
                                Optional<unsigned_char>::Optional
                                          ((Optional<unsigned_char> *)&local_a,None);
                                return (Optional<unsigned_char>)local_a;
                              }
                              goto LAB_0278a60a;
                            }
                            goto LAB_0278a55f;
                          }
                        }
LAB_0278a5f4:
                        local_15[0] = '\x04';
                        Optional<unsigned_char>::Optional
                                  ((Optional<unsigned_char> *)&local_a,local_15);
                        return (Optional<unsigned_char>)local_a;
                      }
LAB_0278a5b2:
                      local_15[3] = 1;
                      Optional<unsigned_char>::Optional
                                ((Optional<unsigned_char> *)&local_a,local_15 + 3);
                      return (Optional<unsigned_char>)local_a;
                    }
                  }
LAB_0278a644:
                  local_1a[3] = 8;
                  Optional<unsigned_char>::Optional
                            ((Optional<unsigned_char> *)&local_a,local_1a + 3);
                  return (Optional<unsigned_char>)local_a;
                }
              }
LAB_0278a60a:
              bVar1 = FormParams::operator_cast_to_bool(&local_e);
              if (!bVar1) {
                Optional<unsigned_char>::Optional((Optional<unsigned_char> *)&local_a,None);
                return (Optional<unsigned_char>)local_a;
              }
              local_16 = FormParams::getDwarfOffsetByteSize(&local_e);
              Optional<unsigned_char>::Optional((Optional<unsigned_char> *)&local_a,&local_16);
              return (Optional<unsigned_char>)local_a;
            }
          }
        }
      }
    }
  }
LAB_0278a55f:
  Optional<unsigned_char>::Optional((Optional<unsigned_char> *)&local_a,None);
  return (Optional<unsigned_char>)local_a;
}

Assistant:

Optional<uint8_t> llvm::dwarf::getFixedFormByteSize(dwarf::Form Form,
                                                    FormParams Params) {
  switch (Form) {
  case DW_FORM_addr:
    if (Params)
      return Params.AddrSize;
    return None;

  case DW_FORM_block:          // ULEB128 length L followed by L bytes.
  case DW_FORM_block1:         // 1 byte length L followed by L bytes.
  case DW_FORM_block2:         // 2 byte length L followed by L bytes.
  case DW_FORM_block4:         // 4 byte length L followed by L bytes.
  case DW_FORM_string:         // C-string with null terminator.
  case DW_FORM_sdata:          // SLEB128.
  case DW_FORM_udata:          // ULEB128.
  case DW_FORM_ref_udata:      // ULEB128.
  case DW_FORM_indirect:       // ULEB128.
  case DW_FORM_exprloc:        // ULEB128 length L followed by L bytes.
  case DW_FORM_strx:           // ULEB128.
  case DW_FORM_addrx:          // ULEB128.
  case DW_FORM_loclistx:       // ULEB128.
  case DW_FORM_rnglistx:       // ULEB128.
  case DW_FORM_GNU_addr_index: // ULEB128.
  case DW_FORM_GNU_str_index:  // ULEB128.
    return None;

  case DW_FORM_ref_addr:
    if (Params)
      return Params.getRefAddrByteSize();
    return None;

  case DW_FORM_flag:
  case DW_FORM_data1:
  case DW_FORM_ref1:
  case DW_FORM_strx1:
  case DW_FORM_addrx1:
    return 1;

  case DW_FORM_data2:
  case DW_FORM_ref2:
  case DW_FORM_strx2:
  case DW_FORM_addrx2:
    return 2;

  case DW_FORM_strx3:
    return 3;

  case DW_FORM_data4:
  case DW_FORM_ref4:
  case DW_FORM_ref_sup4:
  case DW_FORM_strx4:
  case DW_FORM_addrx4:
    return 4;

  case DW_FORM_strp:
  case DW_FORM_GNU_ref_alt:
  case DW_FORM_GNU_strp_alt:
  case DW_FORM_line_strp:
  case DW_FORM_sec_offset:
  case DW_FORM_strp_sup:
    if (Params)
      return Params.getDwarfOffsetByteSize();
    return None;

  case DW_FORM_data8:
  case DW_FORM_ref8:
  case DW_FORM_ref_sig8:
  case DW_FORM_ref_sup8:
    return 8;

  case DW_FORM_flag_present:
    return 0;

  case DW_FORM_data16:
    return 16;

  case DW_FORM_implicit_const:
    // The implicit value is stored in the abbreviation as a SLEB128, and
    // there no data in debug info.
    return 0;

  default:
    break;
  }
  return None;
}